

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O1

int it_ptm_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,uchar *buffer,int length)

{
  uint uVar1;
  byte bVar2;
  uchar uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  IT_ENTRY *entry;
  long lVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar8 = -1;
  if (length != 0) {
    pattern->n_rows = 0;
    pattern->n_entries = 0;
    uVar12 = 0;
    do {
      uVar6 = dumbfile_getc(f);
      iVar8 = (int)uVar12;
      uVar13 = iVar8 + 1;
      buffer[iVar8] = (byte)uVar6;
      pattern->n_entries = pattern->n_entries + 1;
      if ((byte)uVar6 < 0x20) {
        iVar7 = pattern->n_rows + 1;
        pattern->n_rows = iVar7;
        iVar11 = 2;
        if (iVar7 == 0x40) goto LAB_006e243d;
        iVar11 = 1;
        uVar12 = (ulong)uVar13;
        if (iVar8 < 0xffff) goto LAB_006e23d5;
      }
      else {
        uVar1 = ""[(uVar6 & 0xff) >> 5] + uVar13;
        iVar11 = 1;
        if ((int)uVar1 < 0x10000) {
          dumbfile_getnc((char *)(buffer + (int)uVar13),(uint)""[(uVar6 & 0xff) >> 5],f);
          uVar13 = uVar1;
LAB_006e23d5:
          iVar8 = dumbfile_error(f);
          iVar11 = 1;
          if (iVar8 == 0) {
            if (((int)uVar13 < length) || (0x3f < pattern->n_rows)) {
              iVar11 = 0;
            }
            else {
              if (pattern->n_rows < 0x40) {
                uVar12 = (ulong)(int)uVar13;
                if ((int)uVar13 < 0x10001) {
                  uVar13 = 0x10000;
                }
                do {
                  if (0xffff < (long)uVar12) goto LAB_006e243d;
                  buffer[uVar12] = '\0';
                  uVar12 = uVar12 + 1;
                  uVar4 = pattern->n_rows;
                  uVar5 = pattern->n_entries;
                  pattern->n_rows = uVar4 + 1;
                  pattern->n_entries = uVar5 + 1;
                } while ((int)uVar4 < 0x3f);
                iVar11 = 2;
                goto LAB_006e2440;
              }
              iVar11 = 2;
            }
          }
        }
LAB_006e243d:
        uVar12 = (ulong)uVar13;
      }
LAB_006e2440:
    } while (iVar11 == 0);
    if (iVar11 == 2) {
      entry = (IT_ENTRY *)malloc((long)pattern->n_entries * 7);
      pattern->entry = entry;
      iVar8 = -1;
      if (entry != (IT_ENTRY *)0x0) {
        if (0 < (int)uVar12) {
          uVar14 = 0;
          do {
            iVar8 = (int)uVar14;
            lVar9 = (long)iVar8;
            uVar14 = lVar9 + 1;
            bVar2 = buffer[lVar9];
            if (bVar2 == 0) {
              entry->channel = 0xff;
LAB_006e2548:
              entry = entry + 1;
            }
            else if (0x1f < bVar2) {
              entry->mask = '\0';
              entry->channel = bVar2 & 0x1f;
              if ((bVar2 & 0x20) != 0) {
                uVar3 = buffer[uVar14];
                bVar10 = uVar3 - 1;
                if (uVar3 == 0xfe || bVar10 < 0x78) {
                  if (uVar3 == 0xfe) {
                    bVar10 = 0xfe;
                  }
                  entry->note = bVar10;
                  entry->mask = '\x01';
                }
                uVar14 = (ulong)(iVar8 + 3);
                uVar3 = buffer[lVar9 + 2];
                entry->instrument = uVar3;
                if (uVar3 != '\0') {
                  entry->mask = entry->mask | 2;
                }
              }
              if ((bVar2 & 0x40) != 0) {
                iVar8 = (int)uVar14;
                uVar14 = (ulong)(iVar8 + 2);
                _dumb_it_ptm_convert_effect((uint)buffer[iVar8],(uint)buffer[(long)iVar8 + 1],entry)
                ;
              }
              if ((char)bVar2 < '\0') {
                iVar8 = (int)uVar14;
                uVar14 = (ulong)(iVar8 + 1);
                bVar2 = buffer[iVar8];
                entry->volpan = bVar2;
                if (bVar2 < 0x41) {
                  entry->mask = entry->mask | 4;
                }
              }
              goto LAB_006e2548;
            }
          } while ((int)uVar14 < (int)uVar12);
        }
        iVar8 = 0;
      }
    }
    else {
      iVar8 = -1;
    }
  }
  return iVar8;
}

Assistant:

static int it_ptm_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, unsigned char *buffer, int length)
{
	int buflen = 0;
	int bufpos = 0;
	int effect, effectvalue;

	IT_ENTRY *entry;

	unsigned char channel;

	if (!length)
		return -1;

	pattern->n_rows = 0;
	pattern->n_entries = 0;

	/* Read in the pattern data, little by little, and work out how many
	 * entries we need room for. Sorry, but this is just so funny...
	 */
	for (;;) {
		unsigned char b = buffer[buflen++] = dumbfile_getc(f);

#if 1
		static const unsigned char used[8] = {0, 2, 2, 4, 1, 3, 3, 5};
		channel = b & 31;
		b >>= 5;
		pattern->n_entries++;
		if (b) {
			if (buflen + used[b] >= 65536) return -1;
            dumbfile_getnc((char *)buffer + buflen, used[b], f);
			buflen += used[b];
		} else {
			/* End of row */
			if (++pattern->n_rows == 64) break;
			if (buflen >= 65536) return -1;
		}
#else
		if (b == 0) {
			/* End of row */
			pattern->n_entries++;
			if (++pattern->n_rows == 64) break;
			if (buflen >= 65536) return -1;
		} else {
			static const unsigned char used[8] = {0, 2, 2, 4, 1, 3, 3, 5};
			channel = b & 31;
			b >>= 5;
			if (b) {
				pattern->n_entries++;
				if (buflen + used[b] >= 65536) return -1;
				dumbfile_getnc(buffer + buflen, used[b], f);
				buflen += used[b];
			}
		}
#endif

		/* We have ensured that buflen < 65536 at this point, so it is safe
		 * to iterate and read at least one more byte without checking.
		 * However, now would be a good time to check for errors reading from
		 * the file.
		 */

		if (dumbfile_error(f))
			return -1;

		/* Great. We ran out of data, but there should be data for more rows.
		 * Fill the rest with null data...
		 */
		if (buflen >= length && pattern->n_rows < 64)
		{
			while (pattern->n_rows < 64)
			{
				if (buflen >= 65536) return -1;
				buffer[buflen++] = 0;
				pattern->n_entries++;
				pattern->n_rows++;
			}
			break;
		}
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));

	if (!pattern->entry)
		return -1;

	entry = pattern->entry;

	while (bufpos < buflen) {
		unsigned char b = buffer[bufpos++];

		if (b == 0)
		{
			/* End of row */
			IT_SET_END_ROW(entry);
			entry++;
			continue;
		}

		channel = b & 31;

		if (b & 224) {
			entry->mask = 0;
			entry->channel = channel;

			if (b & 32) {
				unsigned char n = buffer[bufpos++];
				if (n == 254 || (n >= 1 && n <= 120)) {
					if (n == 254)
						entry->note = IT_NOTE_CUT;
					else
						entry->note = n - 1;
					entry->mask |= IT_ENTRY_NOTE;
				}

				entry->instrument = buffer[bufpos++];
				if (entry->instrument)
					entry->mask |= IT_ENTRY_INSTRUMENT;
			}

			if (b & 64) {
				effect = buffer[bufpos++];
				effectvalue = buffer[bufpos++];
				_dumb_it_ptm_convert_effect(effect, effectvalue, entry);
			}

			if (b & 128) {
				entry->volpan = buffer[bufpos++];
				if (entry->volpan <= 64)
					entry->mask |= IT_ENTRY_VOLPAN;
			}

			entry++;
		}
	}

	ASSERT(entry == pattern->entry + pattern->n_entries);

	return 0;
}